

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.h
# Opt level: O1

ostream * Fixpp::Type::operator<<(ostream *os,Time *value)

{
  tm *__tp;
  size_t sVar1;
  char local_58 [8];
  char buffer [32];
  time_t local_30;
  time_t time;
  
  local_30 = value->m_time;
  __tp = gmtime(&local_30);
  strftime(local_58,0x20,"%H:%M:%S",__tp);
  sVar1 = strlen(local_58);
  std::__ostream_insert<char,std::char_traits<char>>(os,local_58,sVar1);
  if (((ulong)(value->m_msec).super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    sprintf(local_58,".%03d");
    sVar1 = strlen(local_58);
    std::__ostream_insert<char,std::char_traits<char>>(os,local_58,sVar1);
    if (((ulong)(value->m_usec).super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) != 0) {
      sprintf(local_58,"%03d");
      sVar1 = strlen(local_58);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_58,sVar1);
    }
  }
  return os;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const UTCTimeOnly::Time& value)
        {
            auto time = value.time();
            char buffer[32];
            strftime(buffer, sizeof buffer, "%H:%M:%S", std::gmtime(&time));
            os << buffer;
            if (value.msec())
            {
                sprintf(buffer, ".%03d", value.msec().value());
                os << buffer;
                if (value.usec())
                {
                    sprintf(buffer, "%03d", value.usec().value());
                    os << buffer;
                }
            }
            return os;
        }